

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

bool __thiscall GraphBuilder::matchLocksAndUnlocks(GraphBuilder *this)

{
  long *plVar1;
  LockNode *this_00;
  UnlockNode *unlockNode;
  ulong uVar2;
  bool bVar3;
  _Hash_node_base *p_Var4;
  PSNode *pPVar5;
  PSNode *pPVar6;
  byte bVar7;
  bool bVar8;
  _Hash_node_base *p_Var9;
  const_iterator __begin4;
  const_iterator __begin3;
  Pointer lockPointsTo;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
  mutexPointerIntersection;
  const_iterator local_a0;
  const_iterator local_88;
  PSNode *local_70;
  long lStack_68;
  _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
  local_60 [8];
  undefined4 local_58 [2];
  _Link_type local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  long local_38;
  
  p_Var4 = (this->llvmToLocks_)._M_h._M_before_begin._M_nxt;
  if (p_Var4 == (_Hash_node_base *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = false;
    do {
      this_00 = (LockNode *)p_Var4[2]._M_nxt;
      pPVar5 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                         (*(LLVMPointerGraphBuilder **)(this->pointsToAnalysis_ + 0x88),
                          (Value *)p_Var4[1]._M_nxt);
      for (p_Var9 = (this->llvmToUnlocks_)._M_h._M_before_begin._M_nxt;
          p_Var9 != (_Hash_node_base *)0x0; p_Var9 = p_Var9->_M_nxt) {
        unlockNode = (UnlockNode *)p_Var9[2]._M_nxt;
        pPVar6 = dg::pta::LLVMPointerGraphBuilder::getPointsToNode
                           (*(LLVMPointerGraphBuilder **)(this->pointsToAnalysis_ + 0x88),
                            (Value *)p_Var9[1]._M_nxt);
        local_58[0] = 0;
        local_50 = (_Link_type)0x0;
        local_48 = local_58;
        local_38 = 0;
        local_88.container_it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
              (pPVar5 + 0xc0);
        local_88.container_end.
        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
             (__node_type *)0x0;
        local_88.pos = 0;
        if (*(long *)(pPVar5 + 200) != 0) {
          local_88.pos = 0;
          uVar2 = *(ulong *)((long)local_88.container_it.
                                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                   ._M_cur + 0x10) & 1;
          while (uVar2 == 0) {
            if (local_88.pos == 0x3f) {
              local_88.pos = 0x40;
              break;
            }
            bVar7 = (byte)local_88.pos;
            local_88.pos = local_88.pos + 1;
            uVar2 = *(ulong *)((long)local_88.container_it.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                     ._M_cur + 0x10) >> (bVar7 & 0x3f) & 2;
          }
        }
        local_40 = local_48;
        if ((local_88.pos != 0) ||
           (local_88.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur
            != (__node_type *)0x0)) {
          do {
            plVar1 = (long *)(*(long *)((long)local_88.container_it.
                                              super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                              ._M_cur + 8) * 0x10 + -0x10 +
                             local_88.pos * 0x10 + ___throw_bad_alloc);
            local_70 = (PSNode *)*plVar1;
            lStack_68 = plVar1[1];
            local_a0.container_it.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
                 *(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
                  (pPVar6 + 0xc0);
            local_a0.container_end.
            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
                 (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)
                 (__node_type *)0x0;
            local_a0.pos = 0;
            if (*(long *)(pPVar6 + 200) != 0) {
              local_a0.pos = 0;
              uVar2 = *(ulong *)((long)local_a0.container_it.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                       ._M_cur + 0x10) & 1;
              while (uVar2 == 0) {
                if (local_a0.pos == 0x3f) {
                  local_a0.pos = 0x40;
                  break;
                }
                bVar7 = (byte)local_a0.pos;
                local_a0.pos = local_a0.pos + 1;
                uVar2 = *(ulong *)((long)local_a0.container_it.
                                         super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                         ._M_cur + 0x10) >> (bVar7 & 0x3f) & 2;
              }
            }
            if ((local_a0.pos != 0) ||
               (local_a0.container_it.
                super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                _M_cur != (__node_type *)0x0)) {
              do {
                if (local_70 ==
                    *(PSNode **)
                     (*(long *)((long)local_a0.container_it.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                                      ._M_cur + 8) * 0x10 + -0x10 +
                     local_a0.pos * 0x10 + ___throw_bad_alloc)) {
                  std::
                  _Rb_tree<dg::pta::PSNode*,dg::pta::PSNode*,std::_Identity<dg::pta::PSNode*>,std::less<dg::pta::PSNode*>,std::allocator<dg::pta::PSNode*>>
                  ::_M_insert_unique<dg::pta::PSNode*const&>(local_60,&local_70);
                }
                dg::ADT::
                SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                ::const_iterator::operator++(&local_a0);
              } while (local_a0.container_it.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                       ._M_cur != (__node_type *)0x0 || local_a0.pos != 0);
            }
            dg::ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::const_iterator::operator++(&local_88);
          } while (local_88.container_it.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur != (__node_type *)0x0 || local_88.pos != 0);
          if (local_38 != 0) {
            bVar3 = LockNode::addCorrespondingUnlock(this_00,unlockNode);
            bVar8 = (bool)(bVar8 | bVar3);
          }
        }
        std::
        _Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
        ::_M_erase((_Rb_tree<dg::pta::PSNode_*,_dg::pta::PSNode_*,_std::_Identity<dg::pta::PSNode_*>,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                    *)local_60,local_50);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return bVar8;
}

Assistant:

bool GraphBuilder::matchLocksAndUnlocks() {
    using namespace dg::pta;
    bool changed = false;
    for (auto lock : llvmToLocks_) {
        auto *lockMutexPtr = pointsToAnalysis_->getPointsToNode(lock.first);
        for (auto unlock : llvmToUnlocks_) {
            auto *unlockMutexPtr =
                    pointsToAnalysis_->getPointsToNode(unlock.first);

            std::set<PSNode *> mutexPointerIntersection;
            for (const auto lockPointsTo : lockMutexPtr->pointsTo) {
                for (const auto unlockPointsTo : unlockMutexPtr->pointsTo) {
                    if (lockPointsTo.target == unlockPointsTo.target) {
                        mutexPointerIntersection.insert(lockPointsTo.target);
                    }
                }
            }

            if (!mutexPointerIntersection.empty()) {
                changed |= lock.second->addCorrespondingUnlock(unlock.second);
            }
        }
    }
    return changed;
}